

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * __thiscall
fmt::v7::detail::
format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
::on_format_specs(format_handler<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>,_char,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *this,int id,char *begin,char *end)

{
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> *pbVar1;
  size_t *psVar2;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *this_00;
  char *pcVar3;
  undefined1 value [16];
  undefined1 value_00 [16];
  basic_format_specs<char> specs_00;
  basic_format_specs<char> specs_01;
  basic_format_specs<char> specs_02;
  handle handle;
  basic_string_view<char> value_01;
  long lVar4;
  char *pcVar5;
  basic_format_specs<char> specs;
  format_arg arg;
  unkbyte10 in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff32;
  format_specs local_c8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_b8;
  type local_a8;
  arg_formatter<fmt::v7::detail::buffer_appender<char>,_char> local_98;
  char_spec_handler local_68;
  specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
  local_58;
  
  pcVar5 = (this->parse_context).format_str_.data_;
  lVar4 = (long)begin - (long)pcVar5;
  if (-1 < lVar4) {
    pbVar1 = &this->parse_context;
    pcVar5 = pcVar5 + lVar4;
    (this->parse_context).format_str_.data_ = pcVar5;
    psVar2 = &(this->parse_context).format_str_.size_;
    *psVar2 = *psVar2 - lVar4;
    this_00 = &this->context;
    get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,int>
              ((format_arg *)&local_b8.string,(detail *)this_00,
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *)(ulong)(uint)id
               ,(int)pcVar5);
    if (local_a8 == custom_type) {
      (*(code *)CONCAT62(local_b8.int128_value._10_6_,local_b8.int128_value._8_2_))
                (CONCAT44(local_b8.long_long_value._4_4_,local_b8.int_value),pbVar1,this_00);
      pcVar5 = (pbVar1->format_str_).data_;
    }
    else {
      local_c8.width = 0;
      local_c8.precision = -1;
      local_c8.type = '\0';
      local_c8._9_1_ = 0;
      local_c8.fill.size_ = '\x01';
      local_c8.fill.data_[0] = ' ';
      local_c8.fill.data_[1] = '\0';
      local_c8.fill.data_[2] = '\0';
      local_c8.fill.data_[3] = '\0';
      local_58.checker_.error_handler_ =
           &local_58.
            super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ;
      local_58.checker_.arg_type_ = local_a8;
      local_58.
      super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .super_specs_setter<char>.specs_ = &local_c8;
      local_58.
      super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .parse_context_ = pbVar1;
      local_58.
      super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .context_ = this_00;
      pcVar5 = parse_format_specs<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                         (begin,end,
                          (specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
                           *)local_58.checker_.error_handler_);
      if ((pcVar5 == end) || (*pcVar5 != '}')) {
        error_handler::on_error((error_handler *)begin,"missing \'}\' in format string");
      }
      pcVar3 = (pbVar1->format_str_).data_;
      lVar4 = (long)pcVar5 - (long)pcVar3;
      if (lVar4 < 0) goto LAB_00117c62;
      (this->parse_context).format_str_.data_ = pcVar3 + lVar4;
      psVar2 = &(this->parse_context).format_str_.size_;
      *psVar2 = *psVar2 - lVar4;
      local_98.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (this->context).out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
      ;
      local_98.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .locale_.locale_ = (this->context).loc_.locale_;
      local_98.ptr_ = (char *)0x0;
      local_98.
      super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
      .specs_ = &local_c8;
      local_98.ctx_ = this_00;
      local_98.parse_ctx_ = pbVar1;
      switch(local_a8) {
      case int_type:
        arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        ::write_int<int>(&local_98.
                          super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                         ,local_b8.int_value,&local_c8);
        break;
      case uint_type:
        arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        ::write_int<unsigned_int>
                  (&local_98.
                    super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                   ,local_b8.uint_value,&local_c8);
        break;
      case long_long_type:
        arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        ::write_int<long_long>
                  (&local_98.
                    super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                   ,CONCAT44(local_b8.long_long_value._4_4_,local_b8.int_value),&local_c8);
        break;
      case ulong_long_type:
        arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        ::write_int<unsigned_long_long>
                  (&local_98.
                    super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                   ,CONCAT44(local_b8.long_long_value._4_4_,local_b8.int_value),&local_c8);
        break;
      case int128_type:
        value._10_6_ = in_stack_ffffffffffffff32;
        value._0_10_ = in_stack_ffffffffffffff28;
        arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        ::write_int<__int128>
                  (&local_98.
                    super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                   ,(__int128)value,
                   (format_specs *)CONCAT44(local_b8.long_long_value._4_4_,local_b8.int_value));
        break;
      case uint128_type:
        value_00._10_6_ = in_stack_ffffffffffffff32;
        value_00._0_10_ = in_stack_ffffffffffffff28;
        arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>
        ::write_int<unsigned__int128>
                  ((arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>
                    *)&local_98,(unsigned___int128)value_00,
                   (format_specs *)CONCAT44(local_b8.long_long_value._4_4_,local_b8.int_value));
        break;
      case bool_type:
        local_98.
        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                ::operator()(&local_98.
                              super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                             ,local_b8.bool_value);
        break;
      case char_type:
        local_68.formatter =
             &local_98.
              super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        ;
        local_68.value = local_b8.bool_value;
        handle_char_specs<char,fmt::v7::detail::arg_formatter_base<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::error_handler>::char_spec_handler>
                  (&local_c8,&local_68);
        break;
      case float_type:
        specs_02.type = local_c8.type;
        specs_02._9_1_ = local_c8._9_1_;
        specs_02.width = local_c8.width;
        specs_02.precision = local_c8.precision;
        specs_02.fill.data_[0] = local_c8.fill.data_[0];
        specs_02.fill.data_[1] = local_c8.fill.data_[1];
        specs_02.fill.data_[2] = local_c8.fill.data_[2];
        specs_02.fill.data_[3] = local_c8.fill.data_[3];
        specs_02.fill.size_ = local_c8.fill.size_;
        specs_02._15_1_ = local_c8._15_1_;
        local_98.
        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
             write<char,_fmt::v7::detail::buffer_appender<char>,_float,_0>
                       ((buffer_appender<char>)
                        local_98.
                        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                        .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                        local_b8.float_value,specs_02,
                        local_98.
                        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                        .locale_);
        break;
      case double_type:
        specs_00.type = local_c8.type;
        specs_00._9_1_ = local_c8._9_1_;
        specs_00.width = local_c8.width;
        specs_00.precision = local_c8.precision;
        specs_00.fill.data_[0] = local_c8.fill.data_[0];
        specs_00.fill.data_[1] = local_c8.fill.data_[1];
        specs_00.fill.data_[2] = local_c8.fill.data_[2];
        specs_00.fill.data_[3] = local_c8.fill.data_[3];
        specs_00.fill.size_ = local_c8.fill.size_;
        specs_00._15_1_ = local_c8._15_1_;
        local_98.
        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
             write<char,_fmt::v7::detail::buffer_appender<char>,_double,_0>
                       ((buffer_appender<char>)
                        local_98.
                        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                        .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                        (double)CONCAT44(local_b8.long_long_value._4_4_,local_b8.int_value),specs_00
                        ,local_98.
                         super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                         .locale_);
        break;
      case last_numeric_type:
        specs_01.type = local_c8.type;
        specs_01._9_1_ = local_c8._9_1_;
        specs_01.width = local_c8.width;
        specs_01.precision = local_c8.precision;
        specs_01.fill.data_[0] = local_c8.fill.data_[0];
        specs_01.fill.data_[1] = local_c8.fill.data_[1];
        specs_01.fill.data_[2] = local_c8.fill.data_[2];
        specs_01.fill.data_[3] = local_c8.fill.data_[3];
        specs_01.fill.size_ = local_c8.fill.size_;
        specs_01._15_1_ = local_c8._15_1_;
        local_98.
        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
             write<char,_fmt::v7::detail::buffer_appender<char>,_long_double,_0>
                       ((buffer_appender<char>)
                        local_98.
                        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                        .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
                        (longdouble)
                        CONCAT28(local_b8.int128_value._8_2_,
                                 CONCAT44(local_b8.long_long_value._4_4_,local_b8.int_value)),
                        specs_01,local_98.
                                 super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                                 .locale_);
        break;
      case cstring_type:
        local_98.
        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                ::operator()(&local_98.
                              super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                             ,(char *)CONCAT44(local_b8.long_long_value._4_4_,local_b8.int_value));
        break;
      case string_type:
        value_01.data_._4_4_ = local_b8.long_long_value._4_4_;
        value_01.data_._0_4_ = local_b8.int_value;
        value_01.size_._0_2_ = local_b8.int128_value._8_2_;
        value_01.size_._2_6_ = local_b8.int128_value._10_6_;
        local_98.
        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                ::operator()(&local_98.
                              super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                             ,value_01);
        break;
      case pointer_type:
        local_98.
        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        .out_ = arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                ::operator()(&local_98.
                              super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
                             ,(void *)CONCAT44(local_b8.long_long_value._4_4_,local_b8.int_value));
        break;
      case custom_type:
        handle.custom_.value._4_4_ = local_b8.long_long_value._4_4_;
        handle.custom_.value._0_4_ = local_b8.int_value;
        handle.custom_.format._0_2_ = local_b8.int128_value._8_2_;
        handle.custom_.format._2_6_ = local_b8.int128_value._10_6_;
        local_98.
        super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
        .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
             arg_formatter<fmt::v7::detail::buffer_appender<char>,_char>::operator()
                       (&local_98,handle);
        break;
      default:
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/3rdparty/fmt/include/fmt/format.h"
                    ,0x7d3,"invalid argument type");
      }
      (this_00->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           local_98.
           super_arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           .out_.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
    }
    return pcVar5;
  }
LAB_00117c62:
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/3rdparty/fmt/include/fmt/core.h"
              ,0x13d,"negative value");
}

Assistant:

const Char* on_format_specs(int id, const Char* begin, const Char* end) {
    advance_to(parse_context, begin);
    auto arg = get_arg(context, id);
    custom_formatter<Context> f(parse_context, context);
    if (visit_format_arg(f, arg)) return parse_context.begin();
    basic_format_specs<Char> specs;
    using parse_context_t = basic_format_parse_context<Char>;
    specs_checker<specs_handler<parse_context_t, Context>> handler(
        specs_handler<parse_context_t, Context>(specs, parse_context, context),
        arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}') on_error("missing '}' in format string");
    advance_to(parse_context, begin);
    context.advance_to(
        visit_format_arg(ArgFormatter(context, &parse_context, &specs), arg));
    return begin;
  }